

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenSIMDLoad(BinaryenModuleRef module,BinaryenOp op,uint32_t offset,uint32_t align,
                BinaryenExpressionRef ptr,char *memoryName)

{
  SIMDLoad *this;
  string_view sVar1;
  
  sVar1 = (string_view)getMemoryName(module,memoryName);
  this = (SIMDLoad *)MixedArena::allocSpace(&module->allocator,0x40,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)34>).super_Expression._id = SIMDLoadId;
  (this->super_SpecificExpression<(wasm::Expression::Id)34>).super_Expression.type.id = 0;
  (this->offset).addr = 0;
  (this->align).addr = 0;
  this->op = op;
  (this->offset).addr = (ulong)offset;
  (this->align).addr = (ulong)align;
  this->ptr = ptr;
  (this->memory).super_IString.str = sVar1;
  wasm::SIMDLoad::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenSIMDLoad(BinaryenModuleRef module,
                                       BinaryenOp op,
                                       uint32_t offset,
                                       uint32_t align,
                                       BinaryenExpressionRef ptr,
                                       const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDLoad(SIMDLoadOp(op),
                    Address(offset),
                    Address(align),
                    (Expression*)ptr,
                    getMemoryName(module, memoryName)));
}